

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateInit2(zng_stream *strm,int32_t windowBits)

{
  inflate_state *piVar1;
  uint32_t uVar2;
  zng_stream *strm_00;
  zng_stream *in_RDI;
  inflate_allocs *alloc_bufs;
  int32_t ret;
  inflate_state *state;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int32_t iVar3;
  
  (*functable.force_init)();
  if (in_RDI == (zng_stream *)0x0) {
    iVar3 = -2;
  }
  else {
    in_RDI->msg = (char *)0x0;
    if (in_RDI->zalloc == (alloc_func)0x0) {
      in_RDI->zalloc = zng_zcalloc;
      in_RDI->opaque = (void *)0x0;
    }
    if (in_RDI->zfree == (free_func)0x0) {
      in_RDI->zfree = zng_zcfree;
    }
    strm_00 = (zng_stream *)
              alloc_inflate((zng_stream *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (strm_00 == (zng_stream *)0x0) {
      iVar3 = -4;
    }
    else {
      piVar1 = (inflate_state *)strm_00->total_in;
      piVar1->window = strm_00->next_out;
      piVar1->alloc_bufs = (inflate_allocs *)strm_00;
      piVar1->wbufsize = 0x8040;
      in_RDI->state = (internal_state *)piVar1;
      piVar1->strm = in_RDI;
      piVar1->mode = HEAD;
      uVar2 = (*functable.chunksize)();
      piVar1->chunksize = uVar2;
      iVar3 = zng_inflateReset2((zng_stream *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                (int32_t)((ulong)strm_00 >> 0x20));
      if (iVar3 != 0) {
        free_inflate(strm_00);
      }
    }
  }
  return iVar3;
}

Assistant:

PREFIX(inflateInit2)(PREFIX3(stream) *strm, int32_t windowBits) {
    struct inflate_state *state;
    int32_t ret;

    /* Initialize functable */
    FUNCTABLE_INIT;

    if (strm == NULL)
        return Z_STREAM_ERROR;
    strm->msg = NULL;                   /* in case we return an error */
    if (strm->zalloc == NULL) {
        strm->zalloc = PREFIX(zcalloc);
        strm->opaque = NULL;
    }
    if (strm->zfree == NULL)
        strm->zfree = PREFIX(zcfree);

    inflate_allocs *alloc_bufs = alloc_inflate(strm);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    state = alloc_bufs->state;
    state->window = alloc_bufs->window;
    state->alloc_bufs = alloc_bufs;
    state->wbufsize = INFLATE_ADJUST_WINDOW_SIZE((1 << MAX_WBITS) + 64);
    Tracev((stderr, "inflate: allocated\n"));

    strm->state = (struct internal_state *)state;
    state->strm = strm;
    state->mode = HEAD;     /* to pass state test in inflateReset2() */
    state->chunksize = FUNCTABLE_CALL(chunksize)();
    ret = PREFIX(inflateReset2)(strm, windowBits);
    if (ret != Z_OK) {
        free_inflate(strm);
    }
    return ret;
}